

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,unsigned_int>
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,uint *args_1)

{
  size_t sVar1;
  undefined4 *in_RDX;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_RDI;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  undefined1 local_b9;
  char *local_b8;
  size_t local_b0;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  char *local_98 [4];
  undefined1 *local_78;
  basic_string_view<char> local_70;
  char **local_60;
  basic_string_view<char> local_58 [2];
  longlong local_38;
  size_t local_30;
  
  local_a1 = 1;
  local_a2 = 1;
  local_a3 = 1;
  local_78 = &local_b9;
  local_70 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x18767e);
  local_b8 = local_70.data_;
  local_b0 = local_70.size_;
  local_58[0].data_ = local_70.data_;
  local_58[0].size_ = local_70.size_;
  local_60 = local_98;
  local_98[0] = basic_string_view<char>::data(local_58);
  sVar1 = basic_string_view<char>::size(local_58);
  local_38._0_4_ = *in_RDX;
  (in_RDI->data_).args_[0].field_0.string.data = local_98[0];
  (in_RDI->data_).args_[0].field_0.string.size = sVar1;
  (in_RDI->data_).args_[1].field_0.long_long_value = local_38;
  (in_RDI->data_).args_[1].field_0.string.size = local_30;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}